

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coro.c
# Opt level: O2

void coro_stack_free(coro_stack *stack)

{
  void *pvVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  
  pvVar1 = stack->sptr;
  if (pvVar1 != (void *)0x0) {
    sVar3 = coro_pagesize();
    sVar2 = stack->ssze;
    sVar4 = coro_pagesize();
    munmap((void *)((long)pvVar1 + sVar3 * -4),sVar2 + sVar4 * 4);
    return;
  }
  return;
}

Assistant:

void
coro_stack_free (struct coro_stack *stack)
{
#if CORO_FIBER
  /* nop */
#else
  #if CORO_USE_VALGRIND
    VALGRIND_STACK_DEREGISTER (stack->valgrind_id);
  #endif

  #if CORO_MMAP
    if (stack->sptr)
      munmap ((void*)((char *)stack->sptr - CORO_GUARDPAGES * PAGESIZE),
              stack->ssze                 + CORO_GUARDPAGES * PAGESIZE);
  #else
    free (stack->sptr);
  #endif
#endif
}